

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaInfo.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::SchemaInfo::SchemaInfo
          (SchemaInfo *this,unsigned_short elemAttrDefaultQualified,int blockDefault,
          int finalDefault,int targetNSURI,NamespaceScope *currNamespaceScope,XMLCh *schemaURL,
          XMLCh *targetNSURIString,DOMElement *root,XMLScanner *xmlScanner,MemoryManager *manager)

{
  short *psVar1;
  MemoryManager *pMVar2;
  int iVar3;
  XMLSize_t index;
  RefVectorOf<xercesc_4_0::SchemaInfo> *pRVar4;
  undefined4 extraout_var;
  long lVar5;
  ValueVectorOf<xercesc_4_0::DOMNode_*> *pVVar6;
  undefined4 extraout_var_00;
  ValidationContextImpl *this_00;
  NamespaceScope *this_01;
  XMLCh *pXVar7;
  undefined4 extraout_var_02;
  size_t sVar8;
  undefined4 extraout_var_01;
  
  this->fAdoptInclude = false;
  this->fProcessed = false;
  this->fElemAttrDefaultQualified = elemAttrDefaultQualified;
  this->fBlockDefault = blockDefault;
  this->fFinalDefault = finalDefault;
  this->fTargetNSURI = targetNSURI;
  this->fNamespaceScope = (NamespaceScope *)0x0;
  this->fSchemaRootElement = root;
  this->fIncludeInfoList = (RefVectorOf<xercesc_4_0::SchemaInfo> *)0x0;
  this->fImportedInfoList = (RefVectorOf<xercesc_4_0::SchemaInfo> *)0x0;
  this->fImportingInfoList = (RefVectorOf<xercesc_4_0::SchemaInfo> *)0x0;
  this->fFailedRedefineList = (ValueVectorOf<const_xercesc_4_0::DOMElement_*> *)0x0;
  this->fRecursingAnonTypes = (ValueVectorOf<const_xercesc_4_0::DOMElement_*> *)0x0;
  this->fRecursingTypeNames = (ValueVectorOf<const_char16_t_*> *)0x0;
  this->fNonXSAttList = (ValueVectorOf<xercesc_4_0::DOMNode_*> *)0x0;
  this->fValidationContext = (ValidationContext *)0x0;
  this->fMemoryManager = manager;
  pRVar4 = (RefVectorOf<xercesc_4_0::SchemaInfo> *)XMemory::operator_new(0x30,manager);
  pMVar2 = this->fMemoryManager;
  (pRVar4->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>)._vptr_BaseRefVectorOf =
       (_func_int **)&PTR__BaseRefVectorOf_0041c1c8;
  (pRVar4->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fAdoptedElems = false;
  (pRVar4->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fCurCount = 0;
  (pRVar4->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fMaxCount = 4;
  (pRVar4->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fElemList = (SchemaInfo **)0x0;
  (pRVar4->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fMemoryManager = pMVar2;
  iVar3 = (*pMVar2->_vptr_MemoryManager[3])(pMVar2,0x20);
  (pRVar4->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fElemList =
       (SchemaInfo **)CONCAT44(extraout_var,iVar3);
  lVar5 = 0;
  do {
    (pRVar4->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fElemList[lVar5] = (SchemaInfo *)0x0;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  (pRVar4->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>)._vptr_BaseRefVectorOf =
       (_func_int **)&PTR__RefVectorOf_0041c150;
  this->fImportingInfoList = pRVar4;
  this->fTopLevelComponents[0] =
       (RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher> *)0x0;
  this->fTopLevelComponents[1] =
       (RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher> *)0x0;
  this->fTopLevelComponents[2] =
       (RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher> *)0x0;
  this->fTopLevelComponents[3] =
       (RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher> *)0x0;
  this->fTopLevelComponents[4] =
       (RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher> *)0x0;
  this->fTopLevelComponents[5] =
       (RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher> *)0x0;
  this->fTopLevelComponents[6] =
       (RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher> *)0x0;
  this->fLastTopLevelComponent[0] = (DOMElement *)0x0;
  this->fLastTopLevelComponent[1] = (DOMElement *)0x0;
  this->fLastTopLevelComponent[2] = (DOMElement *)0x0;
  this->fLastTopLevelComponent[3] = (DOMElement *)0x0;
  this->fLastTopLevelComponent[4] = (DOMElement *)0x0;
  this->fLastTopLevelComponent[5] = (DOMElement *)0x0;
  this->fLastTopLevelComponent[6] = (DOMElement *)0x0;
  pVVar6 = (ValueVectorOf<xercesc_4_0::DOMNode_*> *)XMemory::operator_new(0x28,this->fMemoryManager)
  ;
  pMVar2 = this->fMemoryManager;
  pVVar6->fCallDestructor = false;
  pVVar6->fCurCount = 0;
  pVVar6->fMaxCount = 2;
  pVVar6->fElemList = (DOMNode **)0x0;
  pVVar6->fMemoryManager = pMVar2;
  iVar3 = (*pMVar2->_vptr_MemoryManager[3])();
  pVVar6->fElemList = (DOMNode **)CONCAT44(extraout_var_00,iVar3);
  memset((DOMNode **)CONCAT44(extraout_var_00,iVar3),0,pVVar6->fMaxCount << 3);
  this->fNonXSAttList = pVVar6;
  this_00 = (ValidationContextImpl *)XMemory::operator_new(0x48,this->fMemoryManager);
  ValidationContextImpl::ValidationContextImpl(this_00,this->fMemoryManager);
  this->fValidationContext = (ValidationContext *)this_00;
  this_01 = (NamespaceScope *)XMemory::operator_new(0x50,this->fMemoryManager);
  NamespaceScope::NamespaceScope(this_01,currNamespaceScope,this->fMemoryManager);
  this->fNamespaceScope = this_01;
  if (schemaURL == (XMLCh *)0x0) {
    pXVar7 = (XMLCh *)0x0;
  }
  else {
    sVar8 = 0;
    do {
      psVar1 = (short *)((long)schemaURL + sVar8);
      sVar8 = sVar8 + 2;
    } while (*psVar1 != 0);
    iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar8);
    pXVar7 = (XMLCh *)CONCAT44(extraout_var_01,iVar3);
    memcpy(pXVar7,schemaURL,sVar8);
  }
  this->fCurrentSchemaURL = pXVar7;
  if (targetNSURIString == (XMLCh *)0x0) {
    pXVar7 = (XMLCh *)0x0;
  }
  else {
    sVar8 = 0;
    do {
      psVar1 = (short *)((long)targetNSURIString + sVar8);
      sVar8 = sVar8 + 2;
    } while (*psVar1 != 0);
    iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar8);
    pXVar7 = (XMLCh *)CONCAT44(extraout_var_02,iVar3);
    memcpy(pXVar7,targetNSURIString,sVar8);
  }
  this->fTargetNSURIString = pXVar7;
  (*this->fValidationContext->_vptr_ValidationContext[0x10])(this->fValidationContext,xmlScanner);
  (*this->fValidationContext->_vptr_ValidationContext[0x11])
            (this->fValidationContext,this->fNamespaceScope);
  return;
}

Assistant:

SchemaInfo::SchemaInfo(const unsigned short elemAttrDefaultQualified,
                       const int blockDefault,
                       const int finalDefault,
                       const int targetNSURI,
                       const NamespaceScope* const currNamespaceScope,
                       const XMLCh* const schemaURL,
                       const XMLCh* const targetNSURIString,
                       const DOMElement* const root,
                       XMLScanner* xmlScanner,
                       MemoryManager* const manager)
    : fAdoptInclude(false)
    , fProcessed(false)
    , fElemAttrDefaultQualified(elemAttrDefaultQualified)
    , fBlockDefault(blockDefault)
    , fFinalDefault(finalDefault)
    , fTargetNSURI(targetNSURI)
    , fNamespaceScope(0)
    , fSchemaRootElement(root)
    , fIncludeInfoList(0)
    , fImportedInfoList(0)
    , fImportingInfoList(0)
    , fFailedRedefineList(0)
    , fRecursingAnonTypes(0)
    , fRecursingTypeNames(0)
    , fNonXSAttList(0)
    , fValidationContext(0)
    , fMemoryManager(manager)
{
    fImportingInfoList = new (fMemoryManager) RefVectorOf<SchemaInfo>(4, false, fMemoryManager);

	memset(
         fTopLevelComponents,
         0,
         sizeof(fTopLevelComponents[0]) * C_Count);
    memset(
         fLastTopLevelComponent,
         0,
         sizeof(fLastTopLevelComponent[0]) * C_Count);

    fNonXSAttList = new (fMemoryManager) ValueVectorOf<DOMNode*>(2, fMemoryManager);
    fValidationContext = new (fMemoryManager) ValidationContextImpl(fMemoryManager);
    fNamespaceScope = new (fMemoryManager) NamespaceScope(currNamespaceScope, fMemoryManager);
    fCurrentSchemaURL = XMLString::replicate(schemaURL, fMemoryManager);
	fTargetNSURIString = XMLString::replicate(targetNSURIString, fMemoryManager);

    fValidationContext->setScanner (xmlScanner);
    fValidationContext->setNamespaceScope(fNamespaceScope);
}